

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O0

Timer * __thiscall CLI::Timer::to_string_abi_cxx11_(Timer *this)

{
  string *in_RSI;
  undefined1 local_58 [72];
  Timer *this_local;
  
  this_local = this;
  std::__cxx11::string::string((string *)(local_58 + 0x20),in_RSI);
  make_time_str_abi_cxx11_((Timer *)local_58);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::operator()((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (in_RSI + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_58 + 0x20));
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 0x20));
  return this;
}

Assistant:

std::string to_string() const { return time_print_(title_, make_time_str()); }